

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O2

Storyboard * __thiscall ApprovalTests::Storyboard::addFrame(Storyboard *this,string *frame)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  this_00 = &bStack_58;
  if (this->frameCount_ == 0) {
    ::std::__cxx11::string::string((string *)&bStack_58,"Initial Frame",(allocator *)&local_38);
    addFrame(this,&bStack_58,frame);
  }
  else {
    ::std::__cxx11::to_string(&local_38,this->frameCount_);
    ::std::operator+(&bStack_58,"Frame #",&local_38);
    addFrame(this,&bStack_58,frame);
    ::std::__cxx11::string::~string((string *)&bStack_58);
    this_00 = &local_38;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  return this;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& frame)
    {
        if (frameCount_ == 0)
        {
            return addFrame("Initial Frame", frame);
        }
        else
        {
            return addFrame("Frame #" + std::to_string(frameCount_), frame);
        }
    }